

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void idx2::IncreaseCapacity<short,idx2::bitstream>(hash_table<short,_idx2::bitstream> *Ht)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bitstream *in_R8;
  hash_table<short,_idx2::bitstream> *local_98;
  short *local_90;
  hash_table<short,_idx2::bitstream> *local_88;
  long local_80;
  hash_table<short,_idx2::bitstream> NewHt;
  iterator local_40;
  
  NewHt.Keys = (short *)0x0;
  NewHt.LogCapacity = 0;
  NewHt.Alloc = (allocator *)0x0;
  NewHt.Vals = (bitstream *)0x0;
  NewHt.Stats = (bucket_status *)0x0;
  NewHt.Size = 0;
  Init<short,idx2::bitstream>(&NewHt,Ht->LogCapacity + 1,Ht->Alloc);
  Begin<short,idx2::bitstream>(Ht);
  while ((local_88 != Ht || (local_80 != 1L << ((byte)Ht->LogCapacity & 0x3f)))) {
    Insert<short,idx2::bitstream>(&local_40,(idx2 *)&NewHt,local_98,local_90,in_R8);
    lVar4 = local_80 * 2;
    lVar2 = local_80 * 0x30;
    do {
      lVar3 = lVar2;
      lVar4 = lVar4 + 2;
      lVar1 = local_80 + 1;
      local_80 = local_80 + 1;
      lVar2 = lVar3 + 0x30;
    } while (local_88->Stats[lVar1] != Occupied);
    local_98 = (hash_table<short,_idx2::bitstream> *)(lVar4 + (long)local_88->Keys);
    local_90 = (short *)((long)&local_88->Vals[1].Stream.Data + lVar3);
  }
  Dealloc<short,idx2::bitstream>(Ht);
  Ht->Stats = NewHt.Stats;
  Ht->Size = NewHt.Size;
  Ht->LogCapacity = NewHt.LogCapacity;
  Ht->Alloc = NewHt.Alloc;
  Ht->Keys = NewHt.Keys;
  Ht->Vals = NewHt.Vals;
  Ht->Stats = NewHt.Stats;
  Ht->Size = NewHt.Size;
  return;
}

Assistant:

void
IncreaseCapacity(hash_table<k, v>* Ht)
{
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
    Insert(&NewHt, *(It.Key), *(It.Val));
  Dealloc(Ht);
  *Ht = NewHt;
}